

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall Server::Server(Server *this,int listen_port)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  runtime_error *prVar4;
  int *piVar5;
  sockaddr_in sVar6;
  allocator local_e9;
  string local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  undefined1 local_60 [8];
  sockaddr_in listenaddr;
  int opt;
  int local_14;
  Server *pSStack_10;
  int listen_port_local;
  Server *this_local;
  
  local_14 = listen_port;
  pSStack_10 = this;
  std::__cxx11::
  list<std::pair<std::pair<int,_int>,_DNSResolver_*>,_std::allocator<std::pair<std::pair<int,_int>,_DNSResolver_*>_>_>
  ::list(&this->waitingForResolve);
  std::__cxx11::
  list<std::pair<int,_SOCK5ConnectionMaker_*>,_std::allocator<std::pair<int,_SOCK5ConnectionMaker_*>_>_>
  ::list(&this->waitingForHandshake);
  std::__cxx11::list<Connection_*,_std::allocator<Connection_*>_>::list(&this->connections);
  iVar2 = socket(2,1,0);
  this->listen_sockfd = iVar2;
  this->maxfd = 0;
  signal(0xd,(__sighandler_t)0x1);
  bVar1 = add_fd(this,this->listen_sockfd);
  if (!bVar1) {
    listenaddr.sin_zero[6] = '\x01';
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&opt,"Socket number out of range for select",
               (allocator *)(listenaddr.sin_zero + 7));
    std::runtime_error::runtime_error(prVar4,(string *)&opt);
    listenaddr.sin_zero[6] = '\0';
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  listenaddr.sin_zero[0] = '\x01';
  listenaddr.sin_zero[1] = '\0';
  listenaddr.sin_zero[2] = '\0';
  listenaddr.sin_zero[3] = '\0';
  setsockopt(this->listen_sockfd,1,2,listenaddr.sin_zero,4);
  sVar6 = Utils::get_sockaddr((char *)0x0,local_14);
  listenaddr._0_8_ = sVar6.sin_zero;
  local_60 = sVar6._0_8_;
  iVar2 = bind(this->listen_sockfd,(sockaddr *)local_60,0x10);
  if (iVar2 != 0) {
    local_a2 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"bind: ",&local_a1);
    piVar5 = __errno_location();
    strerror(*piVar5);
    std::operator+(local_80,(char *)local_a0);
    std::runtime_error::runtime_error(prVar4,(string *)local_80);
    local_a2 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  signal(0xd,(__sighandler_t)0x1);
  iVar2 = listen(this->listen_sockfd,0x1000);
  if (iVar2 != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"listen: ",&local_e9);
    piVar5 = __errno_location();
    strerror(*piVar5);
    std::operator+(local_c8,(char *)local_e8);
    std::runtime_error::runtime_error(prVar4,(string *)local_c8);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = this->listen_sockfd;
  uVar3 = fcntl(iVar2,3,0);
  iVar2 = fcntl(iVar2,4,(ulong)(uVar3 | 0x800));
  if (iVar2 == -1) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar4,"Can\'t make server socket nonblock!");
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

Server::Server(int listen_port) :
        listen_sockfd(socket(AF_INET, SOCK_STREAM, 0)),
        maxfd(0) {

    signal(SIGPIPE, SIG_IGN);
    if (!add_fd(listen_sockfd)) {
        throw std::runtime_error(std::string("Socket number out of range for select"));
    }
    int opt = 1;
    setsockopt(listen_sockfd, SOL_SOCKET, SO_REUSEADDR, &opt, sizeof(opt));
    struct sockaddr_in listenaddr = Utils::get_sockaddr(NULL, listen_port);


    if (bind(listen_sockfd, reinterpret_cast<struct sockaddr *>(&listenaddr), sizeof(listenaddr))) {
        throw std::runtime_error(std::string("bind: ") + strerror(errno));
    }

    signal(SIGPIPE, SIG_IGN);

    if (listen(listen_sockfd, SOMAXCONN)) {
        throw std::runtime_error(std::string("listen: ") + strerror(errno));
    }
    if (fcntl(listen_sockfd, F_SETFL, fcntl(listen_sockfd, F_GETFL, 0) | O_NONBLOCK) == -1) {
        throw std::runtime_error("Can't make server socket nonblock!");
    }
}